

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::draw_line(OSDText *this,OSDLine *line)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  point box [4];
  float h;
  float w;
  float y2;
  float x2;
  char *text;
  GLuint tex;
  FT_GlyphSlot_conflict g;
  char *p;
  float local_88;
  float local_84;
  undefined4 local_80;
  undefined4 local_7c;
  float local_78;
  float local_74;
  undefined4 local_70;
  undefined4 local_6c;
  float local_68;
  float local_64;
  undefined4 local_60;
  undefined4 local_5c;
  float local_58;
  float local_54;
  undefined4 local_50;
  undefined4 local_4c;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  char *local_30;
  undefined4 local_24;
  long local_20;
  char *local_18;
  
  FT_Set_Pixel_Sizes(**(undefined8 **)(in_RDI + 0x28),0,*(ulong *)(in_RSI + 0x30) & 0xffffffff);
  (*__glewUniform4fv)(*(GLint *)(in_RDI + 0x58),1,(GLfloat *)(in_RSI + 0x38));
  local_20 = *(long *)(**(long **)(in_RDI + 0x28) + 0x98);
  (*__glewActiveTexture)(0x84c0);
  glGenTextures(1,&local_24);
  glBindTexture(0xde1,local_24);
  (*__glewUniform1i)(*(GLint *)(in_RDI + 0x54),0);
  glPixelStorei(0xcf5,1);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  (*__glewEnableVertexAttribArray)(*(GLuint *)(in_RDI + 0x50));
  (*__glewBindBuffer)(0x8892,*(GLuint *)(in_RDI + 0x48));
  (*__glewVertexAttribPointer)(*(GLuint *)(in_RDI + 0x50),4,0x1406,'\0',0,(void *)0x0);
  local_30 = (char *)std::__cxx11::string::c_str();
  for (local_18 = local_30; *local_18 != '\0'; local_18 = local_18 + 1) {
    iVar1 = FT_Load_Char(**(undefined8 **)(in_RDI + 0x28),(long)*local_18,4);
    if (iVar1 == 0) {
      glTexImage2D(0xde1,0,0x1906,*(undefined4 *)(local_20 + 0x9c),*(undefined4 *)(local_20 + 0x98),
                   0,0x1906,0x1401,*(undefined8 *)(local_20 + 0xa8));
      local_88 = (float)*(int *)(local_20 + 0xc0) * *(float *)(in_RDI + 4) + *(float *)(in_RSI + 4);
      local_38 = -(float)*(int *)(local_20 + 0xc4) * *(float *)(in_RDI + 8) - *(float *)(in_RSI + 8)
      ;
      local_3c = (float)*(uint *)(local_20 + 0x9c) * *(float *)(in_RDI + 4);
      local_40 = (float)*(uint *)(local_20 + 0x98) * *(float *)(in_RDI + 8);
      local_84 = -local_38;
      local_80 = 0;
      local_7c = 0;
      local_78 = local_88 + local_3c;
      local_74 = -local_38;
      local_70 = 0x3f800000;
      local_6c = 0;
      local_64 = -local_38 - local_40;
      local_60 = 0;
      local_5c = 0x3f800000;
      local_58 = local_88 + local_3c;
      local_54 = -local_38 - local_40;
      local_50 = 0x3f800000;
      local_4c = 0x3f800000;
      local_68 = local_88;
      local_34 = local_88;
      (*__glewBufferData)(0x8892,0x40,&local_88,0x88e8);
      glDrawArrays(5,0,4);
      *(float *)(in_RSI + 4) =
           (float)(*(long *)(local_20 + 0x80) >> 6) * *(float *)(in_RDI + 4) +
           *(float *)(in_RSI + 4);
      *(float *)(in_RSI + 8) =
           (float)(*(long *)(local_20 + 0x88) >> 6) * *(float *)(in_RDI + 8) +
           *(float *)(in_RSI + 8);
    }
  }
  (*__glewDisableVertexAttribArray)(*(GLuint *)(in_RDI + 0x50));
  glDeleteTextures(1,&local_24);
  return;
}

Assistant:

void OSDText::draw_line(OSDLine line) {

  // set font size
  FT_Set_Pixel_Sizes(*face, 0, line.size);

  // set font color
  glUniform4fv(uniform_color, 1, (GLfloat*) &line.color);

  // get glyph
  const char *p;
  FT_GlyphSlot g = (*face)->glyph;

  // gen texture
  GLuint tex;
  glActiveTexture(GL_TEXTURE0);
  glGenTextures(1, &tex);
  glBindTexture(GL_TEXTURE_2D, tex);
  glUniform1i(uniform_tex, 0);

  // require 1 byte alignment when uploading texture data
  glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

  // clamping to edges is important to prevent artifacts when scaling
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

  // linear filtering usually looks best for text
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

  // set up the VBO for our vertex data
  glEnableVertexAttribArray(attribute_coord);
  glBindBuffer(GL_ARRAY_BUFFER, vbo);
  glVertexAttribPointer(attribute_coord, 4, GL_FLOAT, GL_FALSE, 0, 0);

  // loop through all characters
  const char* text = line.text.c_str();
  for (p = text; *p; p++) {

    // Try to load and render the character
    if (FT_Load_Char(*face, *p, FT_LOAD_RENDER)) continue;

    // Upload the glyph bitmap as an alpha texture
    glTexImage2D(GL_TEXTURE_2D,
                 0, GL_ALPHA, g->bitmap.width, g->bitmap.rows,
                 0, GL_ALPHA, GL_UNSIGNED_BYTE, g->bitmap.buffer);

    // calculate the vertex and texture coordinates
    float x2 =  line.x + g->bitmap_left * sx;
    float y2 = -line.y - g->bitmap_top  * sy;
    float w = g->bitmap.width * sx;
    float h = g->bitmap.rows  * sy;

    point box[4] = {
      {x2, -y2, 0, 0},
      {x2 + w, -y2, 1, 0},
      {x2, -y2 - h, 0, 1},
      {x2 + w, -y2 - h, 1, 1},
    };

    // draw the character to screen
    glBufferData(GL_ARRAY_BUFFER, sizeof box, box, GL_DYNAMIC_DRAW);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // Advance the cursor to the start of the next character
    line.x += (g->advance.x >> 6) * sx;
    line.y += (g->advance.y >> 6) * sy;
  }

  glDisableVertexAttribArray(attribute_coord);
  glDeleteTextures(1, &tex);

}